

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O0

PHYSFS_Io * UNPK_openRead(void *opaque,char *name)

{
  int iVar1;
  UNPKentry *pUVar2;
  PHYSFS_Io *__dest;
  char *pcVar3;
  UNPKentry *entry;
  UNPKfileinfo *finfo;
  UNPKinfo *info;
  PHYSFS_Io *retval;
  char *name_local;
  void *opaque_local;
  
  entry = (UNPKentry *)0x0;
  pUVar2 = findEntry((UNPKinfo *)opaque,name);
  if (pUVar2 != (UNPKentry *)0x0) {
    if ((pUVar2->tree).isdir == 0) {
      __dest = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
      if (__dest == (PHYSFS_Io *)0x0) {
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      }
      else {
        entry = (UNPKentry *)(*__PHYSFS_AllocatorHooks.Malloc)(0x18);
        if (entry == (UNPKentry *)0x0) {
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        }
        else {
          pcVar3 = (char *)(**(code **)(*(long *)((long)opaque + 0x20) + 0x38))
                                     (*(undefined8 *)((long)opaque + 0x20));
          (entry->tree).name = pcVar3;
          if (((entry->tree).name != (char *)0x0) &&
             (iVar1 = (**(code **)((entry->tree).name + 0x20))((entry->tree).name,pUVar2->startPos),
             iVar1 != 0)) {
            *(undefined4 *)&(entry->tree).children = 0;
            (entry->tree).hashnext = &pUVar2->tree;
            memcpy(__dest,&UNPK_Io,0x50);
            __dest->opaque = entry;
            return __dest;
          }
        }
      }
      if (entry != (UNPKentry *)0x0) {
        if ((entry->tree).name != (char *)0x0) {
          (**(code **)((entry->tree).name + 0x48))((entry->tree).name);
        }
        (*__PHYSFS_AllocatorHooks.Free)(entry);
      }
      if (__dest != (PHYSFS_Io *)0x0) {
        (*__PHYSFS_AllocatorHooks.Free)(__dest);
      }
    }
    else {
      PHYSFS_setErrorCode(PHYSFS_ERR_NOT_A_FILE);
    }
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

PHYSFS_Io *UNPK_openRead(void *opaque, const char *name)
{
    PHYSFS_Io *retval = NULL;
    UNPKinfo *info = (UNPKinfo *) opaque;
    UNPKfileinfo *finfo = NULL;
    UNPKentry *entry = findEntry(info, name);

    BAIL_IF_ERRPASS(!entry, NULL);
    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, UNPK_openRead_failed);

    finfo = (UNPKfileinfo *) allocator.Malloc(sizeof (UNPKfileinfo));
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, UNPK_openRead_failed);

    finfo->io = info->io->duplicate(info->io);
    GOTO_IF_ERRPASS(!finfo->io, UNPK_openRead_failed);

    if (!finfo->io->seek(finfo->io, entry->startPos))
        goto UNPK_openRead_failed;

    finfo->curPos = 0;
    finfo->entry = entry;

    memcpy(retval, &UNPK_Io, sizeof (*retval));
    retval->opaque = finfo;
    return retval;

UNPK_openRead_failed:
    if (finfo != NULL)
    {
        if (finfo->io != NULL)
            finfo->io->destroy(finfo->io);
        allocator.Free(finfo);
    } /* if */

    if (retval != NULL)
        allocator.Free(retval);

    return NULL;
}